

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

Opnd * __thiscall IR::ListOpnd::CloneUseInternal(ListOpnd *this,Func *func)

{
  int _count;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ListOpndType **_opnds;
  ListOpndType *pLVar4;
  ListOpnd *this_00;
  size_t sVar5;
  size_t count;
  
  if ((this->super_Opnd).m_kind != OpndKindList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x963,"(m_kind == OpndKindList)","m_kind == OpndKindList");
    if (!bVar2) {
LAB_00613a19:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  _count = this->count;
  count = (size_t)_count;
  if (count == 0) {
    _opnds = (ListOpndType **)&DAT_00000008;
  }
  else {
    sVar5 = 0xffffffffffffffff;
    if (-1 < _count) {
      sVar5 = count * 8;
    }
    _opnds = (ListOpndType **)new__<Memory::JitArenaAllocator>(sVar5,func->m_alloc,0x3eba5c);
    if (0 < _count) {
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      sVar5 = 0;
      do {
        pLVar4 = Item(this,(int)sVar5);
        pLVar4 = (ListOpndType *)Opnd::CloneUse(&pLVar4->super_Opnd,func);
        if ((pLVar4->super_Opnd).m_kind != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar2) goto LAB_00613a19;
          *puVar3 = 0;
        }
        _opnds[sVar5] = pLVar4;
        sVar5 = sVar5 + 1;
      } while (count != sVar5);
    }
  }
  this_00 = (ListOpnd *)new<Memory::JitArenaAllocator>(0x28,func->m_alloc,0x3eba5c);
  ListOpnd(this_00,func,_opnds,_count);
  Memory::DeleteArray<Memory::JitArenaAllocator,IR::RegOpnd*>(func->m_alloc,count,_opnds);
  return &this_00->super_Opnd;
}

Assistant:

Opnd * ListOpnd::CloneUseInternal(Func * func)
{
    Assert(m_kind == OpndKindList);
    int count = Count();
    ListOpndType** opnds = JitAnewArray(func->m_alloc, ListOpndType*, count);
    for (int i = 0; i < count; ++i)
    {
        ListOpndType* newOpnd = Item(i)->CloneUse(func)->AsRegOpnd();
        opnds[i] = newOpnd;
    }
    ListOpnd* newList = ListOpnd::New(func, opnds, count);
    JitAdeleteArray(func->m_alloc, count, opnds);
    return newList;
}